

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtil.cpp
# Opt level: O0

UINT_PTR Math::Rand(void)

{
  undefined4 uVar1;
  UINT_PTR newRand;
  uint PAL_rand;
  
  rand_s((uint *)((long)&newRand + 4));
  uVar1 = newRand._4_4_;
  rand_s((uint *)((long)&newRand + 4));
  return CONCAT44(newRand._4_4_,uVar1);
}

Assistant:

UINT_PTR
Math::Rand()
{
    unsigned int rand;
    rand_s(&rand);
    UINT_PTR newRand = static_cast<UINT_PTR>(rand);

#if TARGET_64
    rand_s(&rand);
    newRand |= static_cast<UINT_PTR>(rand) << 32;
#endif

    return newRand;
}